

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_playlist.cpp
# Opt level: O1

FString __thiscall FPlayList::NextLine(FPlayList *this,FILE *file)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char buffer [512];
  char local_218 [512];
  
  pcVar3 = fgets(local_218,0x200,(FILE *)file);
  while( true ) {
    pcVar2 = local_218;
    if (pcVar3 == (char *)0x0) {
      FString::FString((FString *)this,(char *)"");
      return (FString)(char *)this;
    }
    do {
      pcVar3 = pcVar2;
      cVar1 = *pcVar3;
      pcVar2 = pcVar3 + 1;
    } while (cVar1 != '\0' && cVar1 < '!');
    if ((cVar1 != '#') && (cVar1 != '\0')) break;
    pcVar3 = fgets(local_218,0x200,(FILE *)file);
  }
  FString::FString((FString *)this,pcVar3);
  FString::StripRight((FString *)this,"\r\n");
  FString::ReplaceChars((FString *)this,'\\','/');
  return (FString)(char *)this;
}

Assistant:

FString FPlayList::NextLine (FILE *file)
{
	char buffer[512];
	char *skipper;

	do
	{
		if (NULL == fgets (buffer, countof(buffer), file))
			return "";

		for (skipper = buffer; *skipper != 0 && *skipper <= ' '; skipper++)
			;
	} while (*skipper == '#' || *skipper == 0);

	FString str(skipper);
	str.StripRight("\r\n");
	FixPathSeperator(str);
	return str;
}